

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.cpp
# Opt level: O2

string * __thiscall
LiteScript::_Type_BOOLEAN::ToString_abi_cxx11_
          (string *__return_storage_ptr__,_Type_BOOLEAN *this,Variable *obj)

{
  Object *pOVar1;
  char *pcVar2;
  allocator local_9;
  
  pOVar1 = Variable::operator->(obj);
  pcVar2 = "false";
  if (*pOVar1->data != '\0') {
    pcVar2 = "true";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string LiteScript::_Type_BOOLEAN::ToString(const LiteScript::Variable & obj) const {
    return ((obj->GetData<bool>()) ? "true" : "false");
}